

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

void Abc_TtExpand(word *pTruth0,int nVars,int *pCut0,int nCutSize0,int *pCut,int nCutSize)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  word wVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  word *pwVar12;
  uint uVar13;
  word *pwVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  word *pwVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  word *pwVar23;
  long lVar24;
  long lVar25;
  word *pwVar26;
  word *pLimit;
  
  uVar21 = (ulong)(nCutSize0 - 1);
  if (0 < nCutSize0 && 0 < nCutSize) {
    iVar10 = nVars + -6;
    uVar22 = 1 << ((byte)iVar10 & 0x1f);
    uVar11 = (ulong)uVar22;
    if ((int)uVar22 < 2) {
      uVar11 = 1;
    }
    uVar20 = (ulong)(uint)nCutSize;
    do {
      uVar1 = uVar20 - 1;
      if (pCut[uVar20 - 1] <= pCut0[uVar21]) {
        if (pCut[uVar20 - 1] != pCut0[uVar21]) {
          __assert_fail("pCut[i] == pCut0[k]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x59e,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
        }
        uVar6 = (uint)uVar21;
        if (uVar21 < uVar1) {
          if ((long)nVars < (long)uVar20) {
            __assert_fail("iVar < jVar && jVar < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                          ,0x519,"void Abc_TtSwapVars(word *, int, int, int)");
          }
          bVar8 = (byte)uVar21;
          if ((uint)nVars < 7) {
            uVar17 = *pTruth0;
            bVar8 = (char)(-1 << (bVar8 & 0x1f)) + (char)(1 << ((byte)uVar1 & 0x1f));
            *pTruth0 = (uVar17 & *(ulong *)(uVar21 * 0x90 + 0x8920b0 + uVar1 * 0x18)) >>
                       (bVar8 & 0x3f) |
                       (*(ulong *)(uVar21 * 0x90 + 0x8920a8 + uVar1 * 0x18) & uVar17) <<
                       (bVar8 & 0x3f) | s_PPMasks[uVar21 - 1][uVar20 + 5][0] & uVar17;
          }
          else if (uVar20 < 7) {
            if (iVar10 != 0x1f) {
              bVar8 = (char)(1 << ((byte)uVar1 & 0x1f)) + (char)(-1 << (bVar8 & 0x1f));
              uVar17 = s_PPMasks[uVar21 - 1][uVar20 + 5][0];
              uVar2 = *(ulong *)(uVar21 * 0x90 + 0x8920a8 + uVar1 * 0x18);
              uVar21 = *(ulong *)(uVar21 * 0x90 + 0x8920b0 + uVar1 * 0x18);
              uVar18 = 0;
              do {
                uVar3 = pTruth0[uVar18];
                pTruth0[uVar18] =
                     (uVar3 & uVar21) >> (bVar8 & 0x3f) |
                     (uVar3 & uVar2) << (bVar8 & 0x3f) | uVar3 & uVar17;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
          }
          else if (uVar6 < 6) {
            if (iVar10 != 0x1f) {
              iVar16 = (int)uVar20 + -7;
              bVar9 = (byte)iVar16;
              uVar13 = 1 << (bVar9 & 0x1f);
              iVar7 = 2 << (bVar9 & 0x1f);
              uVar17 = 1;
              if (1 < (int)uVar13) {
                uVar17 = (ulong)uVar13;
              }
              pwVar12 = pTruth0 + (int)uVar13;
              pwVar19 = pTruth0;
              do {
                if (iVar16 != 0x1f) {
                  uVar2 = s_Truths6[uVar21];
                  uVar18 = 0;
                  do {
                    uVar3 = pwVar19[uVar18];
                    bVar9 = (byte)(1 << (bVar8 & 0x1f));
                    uVar4 = pwVar12[uVar18];
                    pwVar19[uVar18] = uVar3 & ~uVar2 | uVar4 << (bVar9 & 0x3f) & uVar2;
                    pwVar12[uVar18] = uVar4 & uVar2 | (uVar3 & uVar2) >> (bVar9 & 0x3f);
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                pwVar19 = pwVar19 + iVar7;
                pwVar12 = pwVar12 + iVar7;
              } while (pwVar19 < pTruth0 + (int)uVar22);
            }
          }
          else if (iVar10 != 0x1f) {
            iVar16 = (int)uVar20 + -7;
            bVar8 = (byte)iVar16;
            bVar9 = (byte)(uVar6 - 6);
            uVar13 = 1 << (bVar9 & 0x1f);
            iVar7 = 2 << (bVar8 & 0x1f);
            uVar21 = 1;
            if (1 < (int)uVar13) {
              uVar21 = (ulong)uVar13;
            }
            lVar15 = (long)(2 << (bVar9 & 0x1f));
            lVar24 = (long)(1 << (bVar8 & 0x1f));
            pwVar12 = pTruth0 + lVar24;
            pwVar19 = pTruth0 + (int)uVar13;
            pwVar23 = pTruth0;
            do {
              if (iVar16 != 0x1f) {
                lVar25 = 0;
                pwVar14 = pwVar19;
                pwVar26 = pwVar12;
                do {
                  if (uVar6 - 6 != 0x1f) {
                    uVar17 = 0;
                    do {
                      wVar5 = pwVar14[uVar17];
                      pwVar14[uVar17] = pwVar26[uVar17];
                      pwVar26[uVar17] = wVar5;
                      uVar17 = uVar17 + 1;
                    } while (uVar21 != uVar17);
                  }
                  lVar25 = lVar25 + lVar15;
                  pwVar26 = pwVar26 + lVar15;
                  pwVar14 = pwVar14 + lVar15;
                } while (lVar25 < lVar24);
              }
              pwVar23 = pwVar23 + iVar7;
              pwVar12 = pwVar12 + iVar7;
              pwVar19 = pwVar19 + iVar7;
            } while (pwVar23 < pTruth0 + (int)uVar22);
          }
        }
        uVar21 = (ulong)(uVar6 - 1);
      }
    } while ((1 < (long)uVar20) && (uVar20 = uVar1, -1 < (int)uVar21));
  }
  if ((int)uVar21 != -1) {
    __assert_fail("k == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0x5a3,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
  }
  return;
}

Assistant:

static inline void Abc_TtExpand( word * pTruth0, int nVars, int * pCut0, int nCutSize0, int * pCut, int nCutSize )
{
    int i, k;
    for ( i = nCutSize - 1, k = nCutSize0 - 1; i >= 0 && k >= 0; i-- )
    {
        if ( pCut[i] > pCut0[k] )
            continue;
        assert( pCut[i] == pCut0[k] );
        if ( k < i )
            Abc_TtSwapVars( pTruth0, nVars, k, i );
        k--;
    }
    assert( k == -1 );
}